

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

void __thiscall hdc::Symbol::Symbol(Symbol *this,Def *def)

{
  int iVar1;
  Def *def_local;
  Symbol *this_local;
  
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->overloadedDescriptors);
  this->kind = SYMBOL_DEF;
  this->descriptor = def;
  iVar1 = Def::getLine(def);
  this->line = iVar1;
  iVar1 = Def::getColumn(def);
  this->column = iVar1;
  return;
}

Assistant:

hdc::Symbol::Symbol(hdc::Def* def) {
    kind = SYMBOL_DEF;
    descriptor = def;
    line = def->getLine();
    column = def->getColumn();
}